

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

void BinarySink_put_wpoint(BinarySink *bs,WeierstrassPoint *point,ec_curve *curve,_Bool bare)

{
  BinarySink *pBVar1;
  strbuf *psVar2;
  uint8_t uVar3;
  uint uVar4;
  undefined3 in_register_00000009;
  BinarySink *pBVar5;
  size_t sVar6;
  strbuf *unaff_R13;
  mp_int *y;
  mp_int *x;
  mp_int *local_48;
  mp_int *local_40;
  strbuf *local_38;
  
  pBVar5 = bs;
  if (CONCAT31(in_register_00000009,bare) == 0) {
    unaff_R13 = strbuf_new();
    pBVar5 = unaff_R13->binarysink_;
  }
  uVar4 = ecc_weierstrass_is_identity(point);
  if (uVar4 == 0) {
    ecc_weierstrass_get_affine(point,&local_40,&local_48);
    BinarySink_put_byte(pBVar5->binarysink_,'\x04');
    sVar6 = curve->fieldBytes;
    psVar2 = unaff_R13;
    if (sVar6 != 0) {
      do {
        local_38 = psVar2;
        sVar6 = sVar6 - 1;
        pBVar1 = pBVar5->binarysink_;
        uVar3 = mp_get_byte(local_40,sVar6);
        BinarySink_put_byte(pBVar1,uVar3);
        unaff_R13 = local_38;
        psVar2 = local_38;
      } while (sVar6 != 0);
      sVar6 = curve->fieldBytes;
      while (sVar6 != 0) {
        sVar6 = sVar6 - 1;
        pBVar1 = pBVar5->binarysink_;
        uVar3 = mp_get_byte(local_48,sVar6);
        BinarySink_put_byte(pBVar1,uVar3);
      }
    }
    mp_free(local_40);
    mp_free(local_48);
  }
  else {
    BinarySink_put_byte(pBVar5->binarysink_,'\0');
  }
  if (!bare) {
    BinarySink_put_stringsb(bs->binarysink_,unaff_R13);
  }
  return;
}

Assistant:

static void BinarySink_put_wpoint(
    BinarySink *bs, WeierstrassPoint *point, const struct ec_curve *curve,
    bool bare)
{
    strbuf *sb;
    BinarySink *bs_inner;

    if (!bare) {
        /*
         * Encapsulate the raw data inside an outermost string layer.
         */
        sb = strbuf_new();
        bs_inner = BinarySink_UPCAST(sb);
    } else {
        /*
         * Just write the data directly to the output.
         */
        bs_inner = bs;
    }

    if (ecc_weierstrass_is_identity(point)) {
        put_byte(bs_inner, 0);
    } else {
        mp_int *x, *y;
        ecc_weierstrass_get_affine(point, &x, &y);

        /*
         * For ECDSA, we only ever output uncompressed points.
         */
        put_byte(bs_inner, 0x04);
        for (size_t i = curve->fieldBytes; i--;)
            put_byte(bs_inner, mp_get_byte(x, i));
        for (size_t i = curve->fieldBytes; i--;)
            put_byte(bs_inner, mp_get_byte(y, i));

        mp_free(x);
        mp_free(y);
    }

    if (!bare)
        put_stringsb(bs, sb);
}